

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O2

handle_base * printable_sbo_cow::clone_impl<hi_printable>(handle_base *param_1)

{
  undefined **ppuVar1;
  
  if ((handle_base *)((ulong)((long)&param_1->_vptr_handle_base + 7U) & 0xfffffffffffffff8) ==
      param_1) {
    ppuVar1 = &PTR__handle_base_001c7530;
  }
  else {
    param_1 = (handle_base *)operator_new(0x18);
    ppuVar1 = &PTR__handle_base_001c75a0;
  }
  param_1->_vptr_handle_base = (_func_int **)ppuVar1;
  param_1[2]._vptr_handle_base = (_func_int **)0x1;
  return param_1;
}

Assistant:

static handle_base * clone_impl (T value, buffer & buf)
    {
        handle_base * retval = nullptr;
        typedef typename std::remove_reference<T>::type handle_t;
        void * buf_ptr = &buf;
        std::size_t buf_size = sizeof(buf);
        const std::size_t alignment = alignof(handle<handle_t, false>);
        const std::size_t size = sizeof(handle<handle_t, false>);
        const bool memcopyable =
            std::is_trivially_destructible<typename std::remove_cv<T>::type>();
        buf_ptr =
            memcopyable ?
            std::align(alignment, size, buf_ptr, buf_size) :
            nullptr;
        if (buf_ptr) {
            new (buf_ptr) handle<handle_t, false>(std::move(value));
            retval = static_cast<handle_base *>(buf_ptr);
        } else {
            retval = new handle<handle_t, true>(std::move(value));
        }
        return retval;
    }